

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O2

void __thiscall icu_63::UVector32::sortedInsert(UVector32 *this,int32_t tok,UErrorCode *ec)

{
  int32_t *piVar1;
  int iVar2;
  UBool UVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = this->count;
  iVar2 = 0;
  while (iVar6 = iVar2, iVar6 != iVar7) {
    iVar4 = (iVar6 + iVar7) / 2;
    iVar2 = iVar4 + 1;
    if (tok < this->elements[iVar4]) {
      iVar7 = iVar4;
      iVar2 = iVar6;
    }
  }
  UVar3 = ensureCapacity(this,this->count + 1,ec);
  if (UVar3 != '\0') {
    piVar1 = this->elements;
    for (lVar5 = (long)this->count; iVar7 < lVar5; lVar5 = lVar5 + -1) {
      piVar1[lVar5] = piVar1[lVar5 + -1];
    }
    piVar1[iVar7] = tok;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector32::sortedInsert(int32_t tok, UErrorCode& ec) {
    // Perform a binary search for the location to insert tok at.  Tok
    // will be inserted between two elements a and b such that a <=
    // tok && tok < b, where there is a 'virtual' elements[-1] always
    // less than tok and a 'virtual' elements[count] always greater
    // than tok.
    int32_t min = 0, max = count;
    while (min != max) {
        int32_t probe = (min + max) / 2;
        //int8_t c = (*compare)(elements[probe], tok);
        //if (c > 0) {
        if (elements[probe] > tok) {
            max = probe;
        } else {
            // assert(c <= 0);
            min = probe + 1;
        }
    }
    if (ensureCapacity(count + 1, ec)) {
        for (int32_t i=count; i>min; --i) {
            elements[i] = elements[i-1];
        }
        elements[min] = tok;
        ++count;
    }
}